

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

bool __thiscall
tetgenmesh::calculateabovepoint
          (tetgenmesh *this,arraypool *facpoints,point *ppa,point *ppb,point *ppc)

{
  point pa_00;
  uint uVar1;
  uint uVar2;
  long *plVar3;
  double dVar4;
  double dVar5;
  uint local_f4;
  int i;
  double z;
  double y;
  double x;
  double area;
  double A;
  double len;
  double lab;
  double n [3];
  double local_98;
  double v2 [3];
  double local_78;
  double v1 [3];
  point local_58;
  point pc;
  point pb;
  point pa;
  point *ppt;
  point *ppc_local;
  point *ppb_local;
  point *ppa_local;
  arraypool *facpoints_local;
  tetgenmesh *this_local;
  
  pa_00 = *(point *)facpoints->toparray[0 >> ((byte)facpoints->log2objectsperblock & 0x1f)];
  local_58 = (point)0x0;
  pc = (point)0x0;
  len = 0.0;
  for (local_f4 = 1; (long)(int)local_f4 < facpoints->objects; local_f4 = local_f4 + 1) {
    plVar3 = (long *)(facpoints->toparray
                      [(int)local_f4 >> ((byte)facpoints->log2objectsperblock & 0x1f)] +
                     (int)((local_f4 & facpoints->objectsperblockmark) * facpoints->objectbytes));
    dVar4 = *(double *)(*plVar3 + 8) - pa_00[1];
    dVar5 = *(double *)(*plVar3 + 0x10) - pa_00[2];
    dVar4 = dVar5 * dVar5 +
            (*(double *)*plVar3 - *pa_00) * (*(double *)*plVar3 - *pa_00) + dVar4 * dVar4;
    if (len < dVar4) {
      pc = (point)*plVar3;
      len = dVar4;
    }
  }
  dVar4 = sqrt(len);
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_78 = *pc - *pa_00;
    v1[0] = pc[1] - pa_00[1];
    v1[1] = pc[2] - pa_00[2];
    area = 0.0;
    for (local_f4 = 1; (long)(int)local_f4 < facpoints->objects; local_f4 = local_f4 + 1) {
      plVar3 = (long *)(facpoints->toparray
                        [(int)local_f4 >> ((byte)facpoints->log2objectsperblock & 0x1f)] +
                       (int)((local_f4 & facpoints->objectsperblockmark) * facpoints->objectbytes));
      local_98 = *(double *)*plVar3 - *pa_00;
      v2[0] = *(double *)(*plVar3 + 8) - pa_00[1];
      v2[1] = *(double *)(*plVar3 + 0x10) - pa_00[2];
      cross(this,&local_78,&local_98,&lab);
      dVar5 = dot(this,&lab,&lab);
      if (area < dVar5) {
        local_58 = (point)*plVar3;
        area = dVar5;
      }
    }
    if ((area != 0.0) || (NAN(area))) {
      facenormal(this,pa_00,pc,local_58,&lab,1,(double *)0x0);
      dVar5 = dot(this,&lab,&lab);
      dVar5 = sqrt(dVar5);
      dVar4 = dVar4 / 2.0;
      *this->dummypoint = dVar4 * (lab / dVar5) + *pa_00;
      this->dummypoint[1] = dVar4 * (n[0] / dVar5) + pa_00[1];
      this->dummypoint[2] = dVar4 * (n[1] / dVar5) + pa_00[2];
      if (ppa != (point *)0x0) {
        *ppa = pa_00;
        *ppb = pc;
        *ppc = local_58;
      }
      this_local._7_1_ = true;
    }
    else {
      if (this->b->quiet == 0) {
        uVar1 = pointmark(this,pa_00);
        uVar2 = pointmark(this,pc);
        printf("Warning:  All points of a facet are collinaer with [%d, %d].\n",(ulong)uVar1,
               (ulong)uVar2);
      }
      this_local._7_1_ = false;
    }
  }
  else {
    if (this->b->quiet == 0) {
      uVar1 = pointmark(this,pa_00);
      printf("Warning:  All points of a facet are coincident with %d.\n",(ulong)uVar1);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool tetgenmesh::calculateabovepoint(arraypool *facpoints, point *ppa,
                                     point *ppb, point *ppc)
{
  point *ppt, pa, pb, pc;
  REAL v1[3], v2[3], n[3];
  REAL lab, len, A, area;
  REAL x, y, z;
  int i;

  ppt = (point *) fastlookup(facpoints, 0);
  pa = *ppt; // a is the first point.
  pb = pc = NULL; // Avoid compiler warnings.

  // Get a point b s.t. the length of [a, b] is maximal.
  lab = 0;
  for (i = 1; i < facpoints->objects; i++) {
    ppt = (point *) fastlookup(facpoints, i);
    x = (*ppt)[0] - pa[0];
    y = (*ppt)[1] - pa[1];
    z = (*ppt)[2] - pa[2];
    len = x * x + y * y + z * z;
    if (len > lab) {
      lab = len;
      pb = *ppt;
    }
  }
  lab = sqrt(lab);
  if (lab == 0) {
    if (!b->quiet) {
      printf("Warning:  All points of a facet are coincident with %d.\n",
        pointmark(pa));
    }
    return false;
  }

  // Get a point c s.t. the area of [a, b, c] is maximal.
  v1[0] = pb[0] - pa[0];
  v1[1] = pb[1] - pa[1];
  v1[2] = pb[2] - pa[2];
  A = 0;
  for (i = 1; i < facpoints->objects; i++) {
    ppt = (point *) fastlookup(facpoints, i);
    v2[0] = (*ppt)[0] - pa[0];
    v2[1] = (*ppt)[1] - pa[1];
    v2[2] = (*ppt)[2] - pa[2];
    cross(v1, v2, n);
    area = dot(n, n);
    if (area > A) {
      A = area;
      pc = *ppt;
    }
  }
  if (A == 0) {
    // All points are collinear. No above point.
    if (!b->quiet) {
      printf("Warning:  All points of a facet are collinaer with [%d, %d].\n",
        pointmark(pa), pointmark(pb));
    }
    return false;
  }

  // Calculate an above point of this facet.
  facenormal(pa, pb, pc, n, 1, NULL);
  len = sqrt(dot(n, n));
  n[0] /= len;
  n[1] /= len;
  n[2] /= len;
  lab /= 2.0; // Half the maximal length.
  dummypoint[0] = pa[0] + lab * n[0];
  dummypoint[1] = pa[1] + lab * n[1];
  dummypoint[2] = pa[2] + lab * n[2];

  if (ppa != NULL) {
    // Return the three points.
    *ppa = pa;
    *ppb = pb;
    *ppc = pc;
  }

  return true;
}